

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O0

int Aig_NodeMffcSupp(Aig_Man_t *p,Aig_Obj_t *pNode,int LevelMin,Vec_Ptr_t *vSupp)

{
  int iVar1;
  int ConeSize2;
  int ConeSize1;
  Vec_Ptr_t *vSupp_local;
  int LevelMin_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  if (vSupp != (Vec_Ptr_t *)0x0) {
    Vec_PtrClear(vSupp);
  }
  iVar1 = Aig_ObjIsNode(pNode);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsCi(pNode);
    if ((iVar1 != 0) && (vSupp != (Vec_Ptr_t *)0x0)) {
      Vec_PtrPush(vSupp,pNode);
    }
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_IsComplement(pNode);
    if (iVar1 != 0) {
      __assert_fail("!Aig_IsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0xbd,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    iVar1 = Aig_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0xbe,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    Aig_ManIncrementTravId(p);
    p_local._4_4_ = Aig_NodeDeref_rec(pNode,LevelMin,(float *)0x0,(float *)0x0);
    Aig_NodeMffcSupp_rec(p,pNode,LevelMin,vSupp,1,(Aig_Obj_t *)0x0);
    iVar1 = Aig_NodeRef_rec(pNode,LevelMin);
    if (p_local._4_4_ != iVar1) {
      __assert_fail("ConeSize1 == ConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0xc3,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    if (p_local._4_4_ < 1) {
      __assert_fail("ConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigMffc.c"
                    ,0xc4,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
  }
  return p_local._4_4_;
}

Assistant:

int Aig_NodeMffcSupp( Aig_Man_t * p, Aig_Obj_t * pNode, int LevelMin, Vec_Ptr_t * vSupp )
{
    int ConeSize1, ConeSize2;
    if ( vSupp ) Vec_PtrClear( vSupp );
    if ( !Aig_ObjIsNode(pNode) )
    {
        if ( Aig_ObjIsCi(pNode) && vSupp )
            Vec_PtrPush( vSupp, pNode );
        return 0;
    }
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    ConeSize1 = Aig_NodeDeref_rec( pNode, LevelMin, NULL, NULL );
    Aig_NodeMffcSupp_rec( p, pNode, LevelMin, vSupp, 1, NULL );
    ConeSize2 = Aig_NodeRef_rec( pNode, LevelMin );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}